

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O2

ParseLocation * __thiscall
embree::ParseStream::location(ParseLocation *__return_storage_ptr__,ParseStream *this)

{
  ParseLocation *pPVar1;
  
  pPVar1 = Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::loc((this->cin).ptr);
  ParseLocation::ParseLocation(__return_storage_ptr__,pPVar1);
  return __return_storage_ptr__;
}

Assistant:

ParseLocation location() { return cin->loc(); }